

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::setBuffer
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,BufKind kind,void *p,
          size_t size)

{
  int32_t *piVar1;
  BufHdr *pBVar2;
  FreeFunc *pFVar3;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_28;
  
  *(undefined8 *)((long)p + 8) = 0;
  *(undefined4 *)((long)p + 0x10) = 0;
  *(undefined4 *)((long)p + 0x14) = 1;
  *(undefined ***)p = &PTR__RefCount_0019ca28;
  *(size_t *)((long)p + 0x18) = size - 0x28;
  *(ulong *)((long)p + 0x20) = (ulong)(kind != BufKind_Shared) << 2;
  local_28.m_p = (BufHdr *)0x0;
  local_28.m_refCount = (RefCount *)0x0;
  rc::Ptr<axl::rc::BufHdr>::copy(&local_28,(EVP_PKEY_CTX *)p,(EVP_PKEY_CTX *)p);
  pBVar2 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
  if (pBVar2 != (BufHdr *)0x0) {
    LOCK();
    piVar1 = &(pBVar2->super_RefCount).m_refCount;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(pBVar2->super_RefCount)._vptr_RefCount)(pBVar2);
      LOCK();
      piVar1 = &(pBVar2->super_RefCount).m_weakRefCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) &&
         (pFVar3 = (pBVar2->super_RefCount).m_freeFunc, pFVar3 != (FreeFunc *)0x0)) {
        (*pFVar3)(pBVar2);
      }
    }
  }
  pBVar2 = local_28.m_p;
  (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p = (C *)(local_28.m_p + 1)
  ;
  *(undefined1 *)&local_28.m_p[1].super_RefCount._vptr_RefCount = 0;
  local_28.m_p = (BufHdr *)0x0;
  local_28.m_refCount = (RefCount *)0x0;
  (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr = pBVar2;
  (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
  (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_isNullTerminated = true;
  rc::Ptr<axl::rc::BufHdr>::clear(&local_28);
  return size - 0x29;
}

Assistant:

size_t
	setBuffer(
		rc::BufKind kind,
		void* p,
		size_t size
	) {
		ASSERT(size >= sizeof(rc::BufHdr) + sizeof(C));

		size_t bufferSize = size - sizeof(rc::BufHdr);
		uint_t flags = kind != rc::BufKind_Static ? rc::BufHdrFlag_Exclusive : 0;

		rc::Ptr<rc::BufHdr> hdr = AXL_RC_NEW_ARGS_INPLACE(rc::BufHdr, (bufferSize, flags), p, NULL);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = (C*)(hdr + 1);
		this->m_p[0] = 0;
		this->m_hdr = hdr.detach();
		this->m_length = 0;
		this->m_isNullTerminated = true;
		return bufferSize / sizeof(C) - 1;
	}